

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void basic_suite::test_false(void)

{
  undefined4 local_68;
  value local_64 [2];
  undefined4 local_5c;
  value local_58 [2];
  undefined4 local_50;
  value local_4c [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [1];
  
  decoder.current.view._M_str._7_1_ = 0x80;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>
            ((decoder *)local_38,(uchar (*) [1])((long)&decoder.current.view._M_str + 7));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0x80;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x35,"void basic_suite::test_false()",local_40,&local_44);
  local_4c[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_38);
  local_50 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x36,"void basic_suite::test_false()",local_4c,&local_50);
  local_58[0] = trial::protocol::bintoken::detail::decoder::category((decoder *)local_38);
  local_5c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x37,"void basic_suite::test_false()",local_58,&local_5c);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_64[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_68 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x39,"void basic_suite::test_false()",local_64,&local_68);
  return;
}

Assistant:

void test_false()
{
    const value_type input[] = { token::code::false_value };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::false_value);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}